

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O2

void tb_invalidate_phys_page_range_m68k
               (uc_struct_conflict3 *uc,tb_page_addr_t start,tb_page_addr_t end)

{
  PageDesc *pages;
  page_collection *set;
  tb_page_addr_t in_R8;
  uintptr_t in_R9;
  
  pages = page_find(uc,start >> 0xc);
  if (pages != (PageDesc *)0x0) {
    set = page_collection_lock_m68k(uc,start,end);
    tb_invalidate_phys_page_range__locked
              (uc,(page_collection *)pages,(PageDesc *)start,end,in_R8,in_R9);
    page_collection_unlock_m68k(set);
    return;
  }
  return;
}

Assistant:

void tb_invalidate_phys_page_range(struct uc_struct *uc, tb_page_addr_t start, tb_page_addr_t end)
{
    struct page_collection *pages;
    PageDesc *p;

    assert_memory_lock();

    p = page_find(uc, start >> TARGET_PAGE_BITS);
    if (p == NULL) {
        return;
    }
    pages = page_collection_lock(uc, start, end);
    tb_invalidate_phys_page_range__locked(uc, pages, p, start, end, 0);
    page_collection_unlock(pages);
}